

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1a_vote.cpp
# Opt level: O3

int main(void)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  istream *piVar5;
  mapped_type *pmVar6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  ostream *poVar9;
  bool bVar10;
  vector<int,_std::allocator<int>_> v;
  size_t k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  m;
  key_type local_88;
  ulong local_68;
  long local_60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_58;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x1061c0) = 0;
  piVar5 = std::istream::_M_extract<unsigned_long>((ulong *)&std::cin);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar5);
  p_Var1 = &local_58._M_impl.super__Rb_tree_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar10 = local_60 != 0;
  local_60 = local_60 + -1;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (bVar10) {
    do {
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity =
           local_88.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::operator>>((istream *)&std::cin,(string *)&local_88);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_58,&local_88);
      *pmVar6 = *pmVar6 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      bVar10 = local_60 != 0;
      local_60 = local_60 + -1;
    } while (bVar10);
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    p_Var7 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_58._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      do {
        if (local_88._M_string_length == local_88.field_2._M_allocated_capacity) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_88,
                     (iterator)local_88._M_string_length,(int *)(p_Var7 + 2));
        }
        else {
          *(_Rb_tree_color *)local_88._M_string_length = p_Var7[2]._M_color;
          local_88._M_string_length = local_88._M_string_length + 4;
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        sVar4 = local_88._M_string_length;
        _Var3._M_p = local_88._M_dataplus._M_p;
      } while ((_Rb_tree_header *)p_Var7 != p_Var1);
      if (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
        uVar8 = (long)(local_88._M_string_length - (long)local_88._M_dataplus._M_p) >> 2;
        lVar2 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_88._M_dataplus._M_p,local_88._M_string_length,
                   ((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (_Var3._M_p,sVar4);
      }
      goto LAB_0010247e;
    }
  }
  local_88.field_2._M_allocated_capacity = 0;
  local_88._M_string_length = 0;
  local_88._M_dataplus._M_p = (pointer)0x0;
LAB_0010247e:
  if ((ulong)((long)(local_88._M_string_length - (long)local_88._M_dataplus._M_p) >> 2) < local_68)
  {
    poVar9 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,*(int *)local_88._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  }
  else {
    poVar9 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        *(int *)(local_88._M_dataplus._M_p +
                                local_68 * -4 +
                                (local_88._M_string_length - (long)local_88._M_dataplus._M_p)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  }
  if ((int *)local_88._M_dataplus._M_p != (int *)0x0) {
    operator_delete(local_88._M_dataplus._M_p,
                    local_88.field_2._M_allocated_capacity - (long)local_88._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_58);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    size_t n, k;
    cin >> n >> k;
    map<string, int> m;

    while (n--) {
        string s;
        cin >> s;
        m[s]++;
    }
    vector<int> v;
    for (auto &x : m) {
        v.push_back(x.second);
    }
    sort(v.begin(), v.end());

    if (k > v.size()) {
        cout << *(v.begin()) << "\n";
    } else {
        cout << *(v.begin() + v.size() - k) << "\n";
    }
}